

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cpp
# Opt level: O1

void DebugRegisterWindow(CDebugWindow *wnd)

{
  if (wnd != (CDebugWindow *)0x0) {
    g_debugWindow = wnd;
    g_debugOutputFlags._0_1_ = (byte)g_debugOutputFlags | 4;
    return;
  }
  g_debugOutputFlags._0_1_ = (byte)g_debugOutputFlags & 0xfb;
  g_debugWindow = (CDebugWindow *)0x0;
  return;
}

Assistant:

void DebugRegisterWindow(CDebugWindow *wnd)
{
    if (wnd==NULL) {
        g_debugOutputFlags &= ~DBG_DEBUGWINDOW;
        g_debugWindow= wnd;
    }
    else {
        g_debugWindow= wnd;
        g_debugOutputFlags |= DBG_DEBUGWINDOW;
    }
}